

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetPropertyCommand.cxx
# Opt level: O2

bool __thiscall
cmSetPropertyCommand::HandleInstall(cmSetPropertyCommand *this,cmInstalledFile *file)

{
  string *prop;
  cmMakefile *mf;
  char *value;
  
  prop = &this->PropertyName;
  if (this->Remove == true) {
    cmInstalledFile::RemoveProperty(file,prop);
  }
  else {
    mf = (this->super_cmCommand).Makefile;
    value = (this->PropertyValue)._M_dataplus._M_p;
    if (this->AppendMode == true) {
      cmInstalledFile::AppendProperty(file,mf,prop,value,this->AppendAsString);
    }
    else {
      cmInstalledFile::SetProperty(file,mf,prop,value);
    }
  }
  return true;
}

Assistant:

bool cmSetPropertyCommand::HandleInstall(cmInstalledFile* file)
{
  // Set or append the property.
  std::string const& name = this->PropertyName;

  cmMakefile* mf = this->Makefile;

  const char *value = this->PropertyValue.c_str();
  if (this->Remove)
    {
    file->RemoveProperty(name);
    }
  else if(this->AppendMode)
    {
    file->AppendProperty(mf, name, value, this->AppendAsString);
    }
  else
    {
    file->SetProperty(mf, name, value);
    }
  return true;
}